

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseTableModuleField(WastParser *this,Module *module)

{
  pointer ppTVar1;
  pointer ppTVar2;
  long lVar3;
  ModuleField *pMVar4;
  TableModuleField *pTVar5;
  TableModuleField *pTVar6;
  ModuleField *pMVar7;
  undefined8 uVar8;
  bool bVar9;
  Result RVar10;
  TokenType TVar11;
  _Head_base<0UL,_wabt::Import_*,_false> import;
  uint64_t uVar12;
  Enum EVar13;
  vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>> *this_00
  ;
  __single_object elem_segment_field;
  string name;
  __single_object table_field;
  Location loc;
  Type elem_type;
  ExprList elem_expr;
  ModuleFieldList export_fields;
  undefined1 local_140 [32];
  long local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  Location local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_c8;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_c0;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_b8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_b0;
  Type local_a8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_a0;
  Var local_98;
  ModuleFieldList local_48;
  
  RVar10 = Expect(this,Lpar);
  if (RVar10.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_98,this);
  local_e8.field_2._M_allocated_capacity = (size_type)local_98.loc.field_1.field_1.offset;
  local_e8.field_2._8_8_ = local_98.loc.field_1._8_8_;
  local_e8._M_dataplus._M_p = (pointer)local_98.loc.filename._M_len;
  local_e8._M_string_length = (size_type)local_98.loc.filename._M_str;
  RVar10 = Expect(this,Table);
  if (RVar10.enum_ == Error) {
    return (Result)Error;
  }
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_140._24_8_ = &local_118;
  ParseBindVarOpt(this,(string *)(local_140 + 0x18));
  local_48.size_ = 0;
  local_48.first_ = (ModuleField *)0x0;
  local_48.last_ = (ModuleField *)0x0;
  EVar13 = Error;
  RVar10 = ParseInlineExports(this,&local_48,Table);
  pMVar7 = local_48.first_;
  if (RVar10.enum_ == Error) goto joined_r0x0013b8d3;
  bVar9 = PeekMatchLpar(this,Import);
  if (bVar9) {
    CheckImportOrdering(this,module);
    import._M_head_impl = (Import *)operator_new(0x90);
    ((import._M_head_impl)->module_name)._M_dataplus._M_p =
         (pointer)&((import._M_head_impl)->module_name).field_2;
    ((import._M_head_impl)->module_name)._M_string_length = 0;
    ((import._M_head_impl)->module_name).field_2._M_local_buf[0] = '\0';
    ((import._M_head_impl)->field_name)._M_dataplus._M_p =
         (pointer)&((import._M_head_impl)->field_name).field_2;
    ((import._M_head_impl)->field_name)._M_string_length = 0;
    ((import._M_head_impl)->field_name).field_2._M_local_buf[0] = '\0';
    (import._M_head_impl)->kind_ = Table;
    (import._M_head_impl)->_vptr_Import = (_func_int **)&PTR__TableImport_0019d6b8;
    import._M_head_impl[1]._vptr_Import =
         (_func_int **)&import._M_head_impl[1].module_name._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(import._M_head_impl + 1),local_140._24_8_,local_120 + local_140._24_8_);
    *(undefined8 *)((long)&import._M_head_impl[1].module_name.field_2 + 8) = 0;
    import._M_head_impl[1].field_name._M_dataplus._M_p = (pointer)0x0;
    *(undefined4 *)((long)&import._M_head_impl[1].field_name._M_dataplus._M_p + 7) = 0;
    import._M_head_impl[1].field_name.field_2._M_allocated_capacity = 0xfffffffffffffff0;
    RVar10 = ParseInlineImport(this,import._M_head_impl);
    if (((RVar10.enum_ == Error) ||
        (RVar10 = ParseLimits(this,(Limits *)((long)&import._M_head_impl[1].module_name.field_2 + 8)
                             ), RVar10.enum_ == Error)) ||
       (RVar10 = ParseRefType(this,(Type *)&import._M_head_impl[1].field_name.field_2.
                                            _M_allocated_capacity), RVar10.enum_ == Error)) {
LAB_0013b8bf:
      (*(((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>
        ).super_ModuleField._vptr_ModuleField[1])(import._M_head_impl);
      pMVar7 = local_48.first_;
      goto joined_r0x0013b8d3;
    }
    GetToken((Token *)&local_98,this);
    local_108.field_1.field_1.offset = local_98.loc.field_1.field_1.offset;
    local_108.field_1._8_8_ = local_98.loc.field_1._8_8_;
    local_108.filename._M_len = local_98.loc.filename._M_len;
    local_108.filename._M_str = local_98.loc.filename._M_str;
    local_a0._M_head_impl = (ImportModuleField *)operator_new(0x48);
    ((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
    ((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
    ((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    _vptr_ModuleField = (_func_int **)&PTR__ModuleField_0019cbf8;
    ((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    loc.filename._M_len = local_108.filename._M_len;
    ((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    loc.filename._M_str = local_108.filename._M_str;
    ((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    loc.field_1.field_1.offset = (size_t)local_108.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
             super_ModuleField.loc.field_1 + 8) = local_108.field_1._8_8_;
    ((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    type_ = Import;
    ((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
    _vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_0019d418;
    ((local_a0._M_head_impl)->import)._M_t.
    super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
    super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = import._M_head_impl;
    Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)&local_a0);
    if (local_a0._M_head_impl != (ImportModuleField *)0x0) {
      (*((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField[1])();
    }
    local_a0._M_head_impl = (ImportModuleField *)0x0;
  }
  else {
    TVar11 = Peek(this,0);
    if (TVar11 == First_Type) {
      RVar10 = ParseRefType(this,&local_a8);
      pMVar7 = local_48.first_;
      if (((RVar10.enum_ == Error) ||
          (RVar10 = Expect(this,Lpar), pMVar7 = local_48.first_, RVar10.enum_ == Error)) ||
         (RVar10 = Expect(this,Elem), pMVar7 = local_48.first_, RVar10.enum_ == Error))
      goto joined_r0x0013b8d3;
      std::make_unique<wabt::ElemSegmentModuleField,wabt::Location&>((Location *)local_140);
      uVar8 = local_140._0_8_;
      ppTVar1 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppTVar2 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      GetToken((Token *)&local_98,this);
      local_108.field_1.field_1.offset = local_98.loc.field_1.field_1.offset;
      local_108.field_1._8_8_ = local_98.loc.field_1._8_8_;
      local_108.filename._M_len = local_98.loc.filename._M_len;
      local_108.filename._M_str = local_98.loc.filename._M_str;
      Var::Var(&local_98,(Index)((ulong)((long)ppTVar1 - (long)ppTVar2) >> 3),&local_108);
      Var::operator=((Var *)(uVar8 + 0x68),&local_98);
      Var::~Var(&local_98);
      local_140._16_8_ = uVar8;
      local_b0._M_head_impl = (Expr *)operator_new(0x90);
      ((local_b0._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      ((local_b0._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      ((local_b0._M_head_impl)->loc).filename._M_len = 0;
      ((local_b0._M_head_impl)->loc).filename._M_str = (char *)0x0;
      *(undefined8 *)((long)&((local_b0._M_head_impl)->loc).filename._M_str + 4) = 0;
      *(undefined8 *)((long)&((local_b0._M_head_impl)->loc).field_1.field_1.offset + 4) = 0;
      (local_b0._M_head_impl)->type_ = Const;
      (local_b0._M_head_impl)->_vptr_Expr = (_func_int **)&PTR__Expr_0019cff8;
      local_b0._M_head_impl[1]._vptr_Expr = (_func_int **)0x0;
      local_b0._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      *(undefined8 *)
       ((long)&local_b0._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ + 4) = 0;
      *(undefined8 *)
       ((long)&local_b0._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.prev_ + 4) = 0;
      local_b0._M_head_impl[1].loc.filename._M_str = (char *)0xffffffffffffffff;
      local_b0._M_head_impl[1].loc.field_1.field_0.last_column = 0;
      *(undefined4 *)&local_b0._M_head_impl[2]._vptr_Expr = 0;
      intrusive_list<wabt::Expr>::push_back
                ((intrusive_list<wabt::Expr> *)(uVar8 + 0xb8),
                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_b0);
      if (local_b0._M_head_impl != (Expr *)0x0) {
        (*(local_b0._M_head_impl)->_vptr_Expr[1])();
      }
      uVar8 = local_140._16_8_;
      local_b0._M_head_impl = (Expr *)0x0;
      if (*(long *)(local_140._16_8_ + 200) == 0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                      ,400,
                      "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                     );
      }
      lVar3 = *(long *)(local_140._16_8_ + 0xc0);
      *(size_type *)(lVar3 + 0x28) = local_e8.field_2._M_allocated_capacity;
      *(undefined8 *)(lVar3 + 0x30) = local_e8.field_2._8_8_;
      *(pointer *)(lVar3 + 0x18) = local_e8._M_dataplus._M_p;
      *(size_type *)(lVar3 + 0x20) = local_e8._M_string_length;
      *(Type *)(local_140._16_8_ + 0xb0) = local_a8;
      local_98.loc.filename._M_len = 0;
      local_98.loc.filename._M_str = (char *)0x0;
      local_98.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      bVar9 = ParseElemExprOpt(this,(ExprList *)&local_98);
      this_00 = (vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                 *)(uVar8 + 0xd0);
      if (bVar9) {
        std::
        vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>::
        emplace_back<wabt::intrusive_list<wabt::Expr>>
                  (this_00,(intrusive_list<wabt::Expr> *)&local_98);
        ParseElemExprListOpt(this,(ExprListVector *)this_00);
      }
      else {
        ParseElemExprVarListOpt(this,(ExprListVector *)this_00);
      }
      local_140._12_4_ = Expect(this,Rpar);
      uVar8 = local_140._16_8_;
      pTVar6 = (TableModuleField *)local_98.loc.filename._M_len;
      if (local_140._12_4_ != Error) {
        std::make_unique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                  (&local_108,&local_e8);
        uVar12 = (*(long *)(uVar8 + 0xd8) - *(long *)(uVar8 + 0xd0) >> 3) * -0x5555555555555555;
        (((Table *)(local_108.filename._M_len + 0x40))->elem_limits).initial = uVar12;
        (((Table *)(local_108.filename._M_len + 0x40))->elem_limits).max = uVar12;
        (((Table *)(local_108.filename._M_len + 0x40))->elem_limits).has_max = true;
        ((Table *)(local_108.filename._M_len + 0x40))->elem_type = local_a8;
        local_b8._M_head_impl = (TableModuleField *)local_108.filename._M_len;
        local_108.filename._M_len = 0;
        Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                    *)&local_b8);
        if (local_b8._M_head_impl != (TableModuleField *)0x0) {
          (*((local_b8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
            super_ModuleField._vptr_ModuleField[1])();
        }
        local_b8._M_head_impl = (TableModuleField *)0x0;
        local_c0._M_head_impl = (ElemSegmentModuleField *)local_140._0_8_;
        local_140._0_8_ = (ElemSegmentModuleField *)0x0;
        Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                    *)&local_c0);
        if (local_c0._M_head_impl != (ElemSegmentModuleField *)0x0) {
          (*((local_c0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
            super_ModuleField._vptr_ModuleField[1])();
        }
        local_c0._M_head_impl = (ElemSegmentModuleField *)0x0;
        pTVar6 = (TableModuleField *)local_98.loc.filename._M_len;
        if ((TableModuleField *)local_108.filename._M_len != (TableModuleField *)0x0) {
          (*(((ModuleFieldMixin<(wabt::ModuleFieldType)5> *)local_108.filename._M_len)->
            super_ModuleField)._vptr_ModuleField[1])();
          pTVar6 = (TableModuleField *)local_98.loc.filename._M_len;
        }
      }
      while (pTVar6 != (TableModuleField *)0x0) {
        pTVar5 = (TableModuleField *)
                 (pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.
                 super_intrusive_list_base<wabt::ModuleField>.next_;
        (*(pTVar6->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.
          _vptr_ModuleField[1])();
        pTVar6 = pTVar5;
      }
      if ((ElemSegmentModuleField *)local_140._0_8_ != (ElemSegmentModuleField *)0x0) {
        (*(((ElemSegmentModuleField *)local_140._0_8_)->
          super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField._vptr_ModuleField[1])
                  ();
      }
      pMVar7 = local_48.first_;
      if (local_140._12_4_ == Error) goto joined_r0x0013b8d3;
    }
    else {
      import._M_head_impl = (Import *)operator_new(0x80);
      (((string *)
       &(((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>
        ).super_ModuleField.super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p =
           (pointer)0x0;
      ((string *)
      &(((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>)
       .super_ModuleField.super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
      (((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
      super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ModuleField_0019cbf8;
      *(undefined4 *)
       ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(((TableModuleField *)import._M_head_impl)->
                   super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc)->
              _M_local_buf + 0x10) = local_e8.field_2._M_allocated_capacity._0_4_;
      *(undefined4 *)
       ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(((TableModuleField *)import._M_head_impl)->
                   super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc)->
              _M_local_buf + 0x14) = local_e8.field_2._M_allocated_capacity._4_4_;
      *(undefined4 *)
       ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(((TableModuleField *)import._M_head_impl)->
                   super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc)->
              _M_local_buf + 0x18) = local_e8.field_2._8_4_;
      *(undefined4 *)
       ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(((TableModuleField *)import._M_head_impl)->
                   super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc)->
              _M_local_buf + 0x1c) = local_e8.field_2._12_4_;
      *(undefined4 *)
       &(((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>
        ).super_ModuleField.loc = local_e8._M_dataplus._M_p._0_4_;
      *(undefined4 *)
       ((long)&(((TableModuleField *)import._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc + 4) =
           local_e8._M_dataplus._M_p._4_4_;
      *(undefined4 *)
       ((long)&(((TableModuleField *)import._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc + 8) =
           (undefined4)local_e8._M_string_length;
      *(undefined4 *)
       ((long)&(((TableModuleField *)import._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.loc + 0xc) =
           local_e8._M_string_length._4_4_;
      *(undefined4 *)
       &(((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>
        ).super_ModuleField.type_ = 5;
      (((TableModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
      super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__TableModuleField_0019d7f8;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&(((TableModuleField *)import._M_head_impl)->table).name =
           &(((TableModuleField *)import._M_head_impl)->table).name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&((TableModuleField *)import._M_head_impl)->table,local_140._24_8_,
                 local_120 + local_140._24_8_);
      ((string *)&(((TableModuleField *)import._M_head_impl)->table).elem_limits)->_M_dataplus =
           (pointer)0x0;
      ((string *)&(((TableModuleField *)import._M_head_impl)->table).elem_limits.max)->_M_dataplus =
           (pointer)0x0;
      *(undefined4 *)
       &((string *)((long)&(((TableModuleField *)import._M_head_impl)->table).elem_limits.max + 7))
        ->_M_dataplus = 0;
      ((string *)&(((TableModuleField *)import._M_head_impl)->table).elem_type)->_M_dataplus =
           (pointer)0xfffffffffffffff0;
      RVar10 = ParseLimits(this,(Limits *)
                                &(((TableModuleField *)import._M_head_impl)->table).elem_limits);
      if ((RVar10.enum_ == Error) ||
         (RVar10 = ParseRefType(this,(Type *)&(((TableModuleField *)import._M_head_impl)->table).
                                              elem_type), RVar10.enum_ == Error)) goto LAB_0013b8bf;
      local_c8._M_head_impl = (TableModuleField *)import._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                  *)&local_c8);
      if (local_c8._M_head_impl != (TableModuleField *)0x0) {
        (*((local_c8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_c8._M_head_impl = (TableModuleField *)0x0;
    }
  }
  anon_unknown_1::AppendInlineExportFields
            (module,&local_48,
             (int)((ulong)((long)(module->tables).
                                 super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(module->tables).
                                super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
  RVar10 = Expect(this,Rpar);
  EVar13 = (Enum)(RVar10.enum_ == Error);
  pMVar7 = local_48.first_;
joined_r0x0013b8d3:
  while (pMVar7 != (ModuleField *)0x0) {
    pMVar4 = (pMVar7->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*pMVar7->_vptr_ModuleField[1])();
    pMVar7 = pMVar4;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._24_8_ != &local_118) {
    operator_delete((void *)local_140._24_8_,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  return (Result)EVar13;
}

Assistant:

Result WastParser::ParseTableModuleField(Module* module) {
  WABT_TRACE(ParseTableModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Table);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Table));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<TableImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->table.elem_limits));
    CHECK_RESULT(ParseRefType(&import->table.elem_type));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (PeekMatch(TokenType::ValueType)) {
    Type elem_type;
    CHECK_RESULT(ParseRefType(&elem_type));

    EXPECT(Lpar);
    EXPECT(Elem);

    auto elem_segment_field = std::make_unique<ElemSegmentModuleField>(loc);
    ElemSegment& elem_segment = elem_segment_field->elem_segment;
    elem_segment.table_var = Var(module->tables.size(), GetLocation());
    elem_segment.offset.push_back(std::make_unique<ConstExpr>(Const::I32(0)));
    elem_segment.offset.back().loc = loc;
    elem_segment.elem_type = elem_type;
    // Syntax is either an optional list of var (legacy), or a non-empty list
    // of elem expr.
    ExprList elem_expr;
    if (ParseElemExprOpt(&elem_expr)) {
      elem_segment.elem_exprs.push_back(std::move(elem_expr));
      // Parse the rest.
      ParseElemExprListOpt(&elem_segment.elem_exprs);
    } else {
      ParseElemExprVarListOpt(&elem_segment.elem_exprs);
    }
    EXPECT(Rpar);

    auto table_field = std::make_unique<TableModuleField>(loc, name);
    table_field->table.elem_limits.initial = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.max = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.has_max = true;
    table_field->table.elem_type = elem_type;
    module->AppendField(std::move(table_field));
    module->AppendField(std::move(elem_segment_field));
  } else {
    auto field = std::make_unique<TableModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->table.elem_limits));
    CHECK_RESULT(ParseRefType(&field->table.elem_type));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tables.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}